

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateCopyFunction
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateCopyFunctionInfo *info)

{
  bool bVar1;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_30;
  StandardEntry *local_28;
  
  make_uniq<duckdb::CopyFunctionCatalogEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::CreateCopyFunctionInfo&>
            ((duckdb *)&local_28,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,this,
             info);
  bVar1 = (info->super_CreateInfo).internal;
  pCVar2 = unique_ptr<duckdb::CopyFunctionCatalogEntry,_std::default_delete<duckdb::CopyFunctionCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::CopyFunctionCatalogEntry,_std::default_delete<duckdb::CopyFunctionCatalogEntry>,_true>
                         *)&local_28);
  local_30._M_head_impl = local_28;
  (pCVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal = bVar1;
  local_28 = (StandardEntry *)0x0;
  oVar3 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_30,(info->super_CreateInfo).on_conflict);
  if (local_30._M_head_impl != (StandardEntry *)0x0) {
    (*((local_30._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_30._M_head_impl = (StandardEntry *)0x0;
  if (local_28 != (StandardEntry *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateCopyFunction(CatalogTransaction transaction,
                                                               CreateCopyFunctionInfo &info) {
	auto copy_function = make_uniq<CopyFunctionCatalogEntry>(catalog, *this, info);
	copy_function->internal = info.internal;
	return AddEntry(transaction, std::move(copy_function), info.on_conflict);
}